

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameWithClusterInfo.cpp
# Opt level: O0

void __thiscall BayesianGameWithClusterInfo::SoftPrint_abi_cxx11_(BayesianGameWithClusterInfo *this)

{
  BayesianGameWithClusterInfo *in_stack_00000408;
  
  SoftPrint_abi_cxx11_(in_stack_00000408);
  return;
}

Assistant:

string BayesianGameWithClusterInfo::SoftPrint() const
{
    stringstream ss;
    ss << "Previous joint policy:"<<endl;
    if(_m_pBGJPol != 0 && _m_pBG != 0)
    {
        for(Index agI=0; agI < GetNrAgents(); agI++)
        {
            ss << "agI=" << agI <<endl;
            TypeClusterList* tl = _m_pBG->_m_typeLists.at(agI);
            {
                Index i=0;
                for(TypeClusterList::const_iterator it = tl->begin();
                        it != tl->end(); it++, i++)
                {
                    ss << "tI "<< i << " - " << (*it)->SoftPrint() 
                        << " Action: " << _m_pBGJPol->GetActionIndex(agI, i)
                        << endl;

                }
            }
        }
        ss << "that lead to the following BG:"<<endl;
    }
    else
        ss << "There is no previous BG or BG-policy"<<endl;



    ss << BayesianGameForDecPOMDPStage::SoftPrint(); 
    ss << "This BG is clustered/clusterable."<<endl;
    ss << "Joint beliefs assoc. with each joint type:"<<endl;
    {
        Index i=0;
        for(vector< JointBeliefInterface* >::const_iterator it=_m_JBs.begin(); 
                it != _m_JBs.end(); it++, i++)
        {
            ss << "jtI="<<i
                << "=" << PrintTools::SoftPrintVector(
                        JointToIndividualTypeIndices(i)
                        )
                << ", repres. jaohI="<< _m_jaohReps.at(i)
            //GetPUDecPOMDPDiscrete()->GetJointActionObservationHistoryTree(_m_jaohReps.at(i))->
                    //GetJointActionObservationHistory()->
                    //SoftPrintJointIndicesconst()
                <<", jb="<< (*it)->SoftPrint() 
            << endl;
        }
    }
    ss << "Type lists of agents:"<<endl;
    for(Index agI=0; agI < GetNrAgents(); agI++)
    {
        ss << "agI=" << agI << ", types:"<<endl;
        TypeClusterList* tl = _m_typeLists.at(agI);
        {
            Index i=0;
            for(TypeClusterList::const_iterator it = tl->begin();
                    it != tl->end(); it++, i++)
            {
                ss << "tI "<< i << " - " << (*it)->SoftPrint() << endl;
            }
        }
    }

    return(ss.str());
}